

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O3

int __thiscall foxxll::ufs_file_base::close(ufs_file_base *this,int __fd)

{
  int iVar1;
  int extraout_EAX;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  unique_lock<std::mutex> fd_lock;
  ostringstream msg;
  unique_lock<std::mutex> local_1b8;
  string local_1a8;
  ostringstream local_188 [376];
  
  local_1b8._M_device = &this->fd_mutex_;
  local_1b8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1b8);
  local_1b8._M_owns = true;
  if (this->file_des_ != -1) {
    iVar1 = ::close(this->file_des_);
    if (iVar1 < 0) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188,"void foxxll::ufs_file_base::close()",0x23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"close() fd=",0xb);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_188,this->file_des_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      this_00 = (io_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      io_error::io_error(this_00,&local_1a8);
      __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    this->file_des_ = -1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_1b8);
  return extraout_EAX;
}

Assistant:

void ufs_file_base::close()
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    if (file_des_ == -1)
        return;

    if (::close(file_des_) < 0)
        FOXXLL_THROW_ERRNO(io_error, "close() fd=" << file_des_);

    file_des_ = -1;
}